

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O2

void __thiscall MILBlob::Fp8E5M2::SetFloat(Fp8E5M2 *this,float f)

{
  uint uVar1;
  range_error *this_00;
  byte bVar2;
  FloatCast fp32;
  
  bVar2 = (byte)((uint)f >> 0x18) & 0x80;
  (this->data).byte = bVar2;
  if (NAN(f)) {
    bVar2 = bVar2 | 0x7d;
  }
  else {
    if (ABS(f) != INFINITY) {
      if ((f == 0.0) && (!NAN(f))) {
        return;
      }
      uVar1 = (uint)f >> 0x17 & 0xff;
      if (uVar1 < 0x8f) {
        if (0x6e < uVar1) {
          HandleFp32ToFp8ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>
                    (&this->data,&fp32);
          return;
        }
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Fp8E5M2 SetFloat exponent underflow.");
      }
      else {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Fp8E5M2 SetFloat exponent overflow.");
      }
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    bVar2 = bVar2 | 0x7c;
  }
  (this->data).byte = bVar2;
  return;
}

Assistant:

void Fp8E5M2::SetFloat(float f)
{
    FloatCast fp32 = {.f = f};
    data = {.byte = 0};
    // Set sign bit.
    data.components.sign = fp32.components.sign;

    // If f is nan or inf, set exponent to all 1's.
    if (std::isnan(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 1;
    } else if (std::isinf(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 0;
    } else if (f == 0) {
        data.components.exponent = 0;
        data.components.mantissa = 0;
    } else {
        int32_t unbiasedExponent = fp32.components.exponent - fp32ExponentBias;
        // Float is normal or denormal, check the exponent and set it.
        // For now, we throw on over/underflows. There are alternative ways to handle
        // this (round to zero).
        if (unbiasedExponent > fp8ExponentBias) {
            throw std::range_error("Fp8E5M2 SetFloat exponent overflow.");
        } else if (unbiasedExponent < (-1 * fp8ExponentBias - int32_t(fp8MantissaBits) + 1)) {
            throw std::range_error("Fp8E5M2 SetFloat exponent underflow.");
        }
        HandleFp32ToFp8ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    }
}